

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

bool __thiscall
Clasp::SatPreprocessor::preprocess(SatPreprocessor *this,SharedContext *ctx,Options *opts)

{
  Var VVar1;
  uint uVar2;
  Literal x;
  Solver *this_00;
  pointer pLVar3;
  pointer pVVar4;
  undefined8 uVar5;
  Options OVar6;
  pointer ppCVar7;
  Clause *pCVar8;
  bool bVar9;
  Share SVar10;
  uint32 defFilter;
  int iVar11;
  SatPreprocessor *pSVar12;
  uint uVar13;
  size_type i_1;
  Var v;
  size_type sVar14;
  ulong uVar15;
  void *mem_1;
  void *mem;
  long lVar16;
  size_type i;
  pointer pPVar17;
  Result RVar18;
  Freeze act;
  OnExit onExit;
  
  this->ctx_ = ctx;
  this->opts_ = opts;
  this_00 = *(ctx->solvers_).ebo_.buf;
  onExit.rest = (SatPreprocessor *)0x0;
  pSVar12 = (SatPreprocessor *)((ctx->satPrepro).ptr_ & 0xfffffffffffffffe);
  if (pSVar12 == this) {
    (ctx->satPrepro).ptr_ = (uintp)pSVar12;
    onExit.rest = pSVar12;
  }
  pLVar3 = (this->units_).ebo_.buf;
  uVar13 = (this->units_).ebo_.size;
  lVar16 = 0;
  onExit.ctx = ctx;
  onExit.self = this;
  do {
    if ((ulong)uVar13 << 2 == lVar16) {
      (this->units_).ebo_.size = 0;
      bVar9 = Solver::propagate(this_00);
      if (bVar9) {
        SVar10 = ctx->share_;
        if (((uint)SVar10 >> 0x1b & 1) != 0) {
          *opts = (Options)((ulong)*opts & 0xfffffffffffffffc | (ulong)(((ulong)*opts & 3) != 0));
          SVar10 = ctx->share_;
        }
        if (((uint)SVar10 >> 0x1c & 1) != 0) {
          pPVar17 = (ctx->output).preds_.ebo_.buf;
          for (lVar16 = (ulong)(ctx->output).preds_.ebo_.size << 4; lVar16 != 0;
              lVar16 = lVar16 + -0x10) {
            SharedContext::setFrozen(ctx,(pPVar17->cond).rep_ >> 2,true);
            pPVar17 = pPVar17 + 1;
          }
          VVar1 = (ctx->output).vars_.hi;
          for (v = (ctx->output).vars_.lo; VVar1 != v; v = v + 1) {
            SharedContext::setFrozen(ctx,v,true);
          }
          SVar10 = ctx->share_;
        }
        if (((uint)SVar10 >> 0x1d & 1) != 0) {
          pVVar4 = (ctx->heuristic).entries_.ebo_.buf;
          uVar13 = (ctx->heuristic).entries_.ebo_.size;
          for (lVar16 = 0; (ulong)uVar13 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
            uVar5 = *(undefined8 *)(&pVVar4->field_0x0 + lVar16);
            if ((byte)(*(byte *)((long)((*(ctx->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf +
                                (ulong)((int)uVar5 * 2 & 0xfffffffc)) & 3) !=
                (byte)(2 - ((byte)uVar5 & 1))) {
              SharedContext::setFrozen(ctx,(uint)((ulong)uVar5 >> 0x20) & 0x3fffffff,true);
            }
          }
          act.super_DefaultAction._vptr_DefaultAction = (_func_int **)&PTR__DefaultAction_001e9918;
          act.ctx = ctx;
          defFilter = SharedContext::defaultDomPref(ctx);
          DomainTable::applyDefault(ctx,&act.super_DefaultAction,defFilter);
        }
        OVar6 = *opts;
        if (((ulong)OVar6 & 0xfe000000) == 0) {
LAB_00159b00:
          bVar9 = false;
        }
        else {
          uVar13 = (this->ctx_->stats_).vars.frozen;
          if (uVar13 == 0) goto LAB_00159b00;
          uVar2 = (this_00->assign_).trail.ebo_.size;
          for (lVar16 = 0; (ulong)uVar2 << 2 != lVar16; lVar16 = lVar16 + 4) {
            uVar13 = uVar13 + (int)((char)((this->ctx_->varInfo_).ebo_.buf
                                           [*(uint *)((long)&((this_00->assign_).trail.ebo_.buf)->
                                                             rep_ + lVar16) >> 2].rep * '\x02') >> 7
                                   );
          }
          bVar9 = (double)((uint)((ulong)OVar6 >> 0x19) & 0x7f) <
                  ((double)uVar13 /
                  (double)(~((this_00->assign_).elims_ + uVar2) +
                          (this_00->assign_).assign_.ebo_.size)) * 100.0;
        }
        if (((((ulong)OVar6 & 3) == 0) ||
            ((OVar6._4_4_ & 0xffff) * 1000 < (this->clauses_).ebo_.size &&
             ((ulong)OVar6 & 0xffff00000000) != 0 || bVar9)) ||
           (iVar11 = (*this->_vptr_SatPreprocessor[3])(this,opts), (char)iVar11 == '\0')) {
LAB_00159c47:
          bVar9 = Solver::simplify(this_00);
          uVar15 = 0;
          if (!bVar9) goto LAB_00159cbb;
          do {
            sVar14 = (size_type)uVar15;
            if (sVar14 == (this->clauses_).ebo_.size) {
              act.super_DefaultAction._vptr_DefaultAction = (_func_int **)(this->clauses_).ebo_.buf;
              (this->clauses_).ebo_.buf = (pointer)0x0;
              (this->clauses_).ebo_.size = 0;
              act.ctx = (SharedContext *)CONCAT44((this->clauses_).ebo_.cap,sVar14);
              (this->clauses_).ebo_.cap = 0;
              bk_lib::
              pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
              ::ebo::~ebo((ebo *)&act);
              uVar15 = 1;
              goto LAB_00159cbb;
            }
            pCVar8 = (this->clauses_).ebo_.buf[uVar15];
            if (pCVar8 != (Clause *)0x0) {
              act.ctx = (SharedContext *)pCVar8->lits_;
              act.super_DefaultAction._vptr_DefaultAction =
                   (_func_int **)((ulong)(*(uint *)&pCVar8->field_0x8 & 0x3fffffff) << 0x20);
              RVar18 = ClauseCreator::create(this_00,(ClauseRep *)&act,0);
              if (((undefined1  [16])RVar18 & (undefined1  [16])0x2) != (undefined1  [16])0x0)
              goto LAB_00159cb9;
              (this->clauses_).ebo_.buf[uVar15] = (Clause *)0x0;
              operator_delete(pCVar8);
            }
            uVar15 = (ulong)(sVar14 + 1);
          } while( true );
        }
        uVar13 = 0;
        uVar15 = 0;
        while( true ) {
          ppCVar7 = (this->clauses_).ebo_.buf;
          if ((size_type)uVar15 == (this->clauses_).ebo_.size) break;
          pCVar8 = ppCVar7[uVar15];
          ppCVar7[uVar15] = (Clause *)0x0;
          Clause::simplify(pCVar8,this_00);
          x.rep_ = pCVar8->lits_[0].rep_;
          if ((*(byte *)((long)(this_00->assign_).assign_.ebo_.buf + (ulong)(x.rep_ & 0xfffffffc)) &
              3) == 0) {
            (this->clauses_).ebo_.buf[uVar13] = pCVar8;
            uVar13 = uVar13 + 1;
          }
          else {
            operator_delete(pCVar8);
            bVar9 = SharedContext::addUnary(ctx,x);
            if (!bVar9) goto LAB_00159cb9;
          }
          uVar15 = (ulong)((size_type)uVar15 + 1);
        }
        bk_lib::
        pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        ::erase(&this->clauses_,ppCVar7 + uVar13,ppCVar7 + uVar15);
        freezeSeen(this);
        bVar9 = Solver::propagate(this_00);
        if ((bVar9) && (iVar11 = (*this->_vptr_SatPreprocessor[4])(this), (char)iVar11 != '\0'))
        goto LAB_00159c47;
      }
      break;
    }
    bVar9 = SharedContext::addUnary(ctx,(Literal)*(uint32 *)((long)&pLVar3->rep_ + lVar16));
    lVar16 = lVar16 + 4;
  } while (bVar9);
LAB_00159cb9:
  uVar15 = 0;
LAB_00159cbb:
  preprocess::OnExit::~OnExit(&onExit);
  return SUB81(uVar15,0);
}

Assistant:

bool SatPreprocessor::preprocess(SharedContext& ctx, Options& opts) {
	ctx_  = &ctx;
	opts_ = &opts;
	Solver* s = ctx_->master();
	struct OnExit {
		SharedContext*   ctx;
		SatPreprocessor* self;
		SatPreprocessor* rest;
		OnExit(SatPreprocessor* s, SharedContext* c) : ctx(c), self(s), rest(0) {
			if (ctx && ctx->satPrepro.get() == s) { rest = ctx->satPrepro.release(); }
		}
		~OnExit() {
			if (self) self->cleanUp();
			if (rest) ctx->satPrepro.reset(rest);
		}
	} onExit(this, &ctx);
	for (LitVec::const_iterator it = units_.begin(), end = units_.end(); it != end; ++it) {
		if (!ctx.addUnary(*it)) return false;
	}
	units_.clear();
	// skip preprocessing if other constraints are UNSAT
	if (!s->propagate()) return false;
	if (ctx.preserveModels()) {
		opts.disableBce();
	}
	if (ctx.preserveShown()) {
		for (OutputTable::pred_iterator it = ctx.output.pred_begin(), end = ctx.output.pred_end(); it != end; ++it) {
			ctx.setFrozen(it->cond.var(), true);
		}
		for (OutputTable::range_iterator it = ctx.output.vars_begin(), end = ctx.output.vars_end(); it != end; ++it) {
			ctx.setFrozen(*it, true);
		}
	}
	if (ctx.preserveHeuristic()) {
		for (DomainTable::iterator it = ctx.heuristic.begin(), end = ctx.heuristic.end(); it != end; ++it) {
			if (!ctx.master()->isFalse(it->cond())) {
				ctx.setFrozen(it->var(), true);
			}
		}
		struct Freeze : DomainTable::DefaultAction {
			explicit Freeze(SharedContext& c) : ctx(&c) {}
			void atom(Literal p, HeuParams::DomPref, uint32) { ctx->setFrozen(p.var(), true); }
			SharedContext* ctx;
		} act(ctx);
		DomainTable::applyDefault(ctx, act, ctx.defaultDomPref());
	}

	// preprocess only if not too many vars are frozen or not too many clauses
	bool limFrozen = false;
	if (opts.limFrozen != 0 && ctx_->stats().vars.frozen) {
		uint32 varFrozen = ctx_->stats().vars.frozen;
		for (LitVec::const_iterator it = s->trail().begin(), end = s->trail().end(); it != end; ++it) {
 			varFrozen -= (ctx_->varInfo(it->var()).frozen());
 		}
		limFrozen = ((varFrozen / double(s->numFreeVars())) * 100.0) > double(opts.limFrozen);
	}
	// 1. remove SAT-clauses, strengthen clauses w.r.t false literals, attach
	if (opts.type != 0 && !opts.clauseLimit(numClauses()) && !limFrozen && initPreprocess(opts)) {
		ClauseList::size_type j = 0;
		for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
			Clause* c   = clauses_[i]; assert(c);
			clauses_[i] = 0;
			c->simplify(*s);
			Literal x   = (*c)[0];
			if (s->value(x.var()) == value_free) {
				clauses_[j++] = c;
			}
			else {
				c->destroy();
				if (!ctx.addUnary(x)) { return false; }
			}
		}
		clauses_.erase(clauses_.begin()+j, clauses_.end());
		// 2. run preprocessing
		freezeSeen();
		if (!s->propagate() || !doPreprocess()) {
			return false;
		}
	}
	// simplify other constraints w.r.t any newly derived top-level facts
	if (!s->simplify()) return false;
	// 3. move preprocessed clauses to ctx
	for (ClauseList::size_type i = 0; i != clauses_.size(); ++i) {
		if (Clause* c = clauses_[i]) {
			if (!ClauseCreator::create(*s, ClauseRep::create(&(*c)[0], c->size()), 0)) {
				return false;
			}
			clauses_[i] = 0;
			c->destroy();
		}
	}
	ClauseList().swap(clauses_);
	return true;
}